

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O2

void __thiscall
Json::StyledStreamWriter::writeCommentAfterValueOnSameLine(StyledStreamWriter *this,Value *root)

{
  ostream *poVar1;
  _Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
  _Var2;
  Comments *this_00;
  String local_40;
  
  _Var2._M_head_impl =
       (root->comments_).ptr_._M_t.
       super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
       .
       super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
       ._M_head_impl;
  if (_Var2._M_head_impl !=
      (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL> *
      )0x0) {
    this_00 = &root->comments_;
    if (*(size_type *)((long)(_Var2._M_head_impl)->_M_elems + 0x28) != 0) {
      poVar1 = std::operator<<(this->document_,' ');
      Value::Comments::get_abi_cxx11_(&local_40,this_00,commentAfterOnSameLine);
      std::operator<<(poVar1,(string *)&local_40);
      std::__cxx11::string::~string((string *)&local_40);
      _Var2._M_head_impl =
           (this_00->ptr_)._M_t.
           super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
           .
           super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
           ._M_head_impl;
      if (_Var2._M_head_impl ==
          (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
           *)0x0) goto LAB_0011142f;
    }
    if ((_Var2._M_head_impl)->_M_elems[2]._M_string_length != 0) {
      writeIndent(this);
      poVar1 = this->document_;
      Value::Comments::get_abi_cxx11_(&local_40,this_00,commentAfter);
      std::operator<<(poVar1,(string *)&local_40);
      std::__cxx11::string::~string((string *)&local_40);
    }
  }
LAB_0011142f:
  this->field_0x68 = this->field_0x68 & 0xfd;
  return;
}

Assistant:

void StyledStreamWriter::writeCommentAfterValueOnSameLine(const Value& root) {
  if (root.hasComment(commentAfterOnSameLine))
    *document_ << ' ' << root.getComment(commentAfterOnSameLine);

  if (root.hasComment(commentAfter)) {
    writeIndent();
    *document_ << root.getComment(commentAfter);
  }
  indented_ = false;
}